

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

Section * mocker::genDataSection(Section *__return_storage_ptr__,Module *irModule)

{
  bool bVar1;
  GlobalVarList *this;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  reference local_78;
  GlobalVar *var;
  const_iterator __end1;
  const_iterator __begin1;
  GlobalVarList *__range1;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  Module *local_18;
  Module *irModule_local;
  Section *res;
  
  local_19 = 0;
  local_18 = irModule;
  irModule_local = (Module *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,".data",&local_41);
  nasm::Section::Section(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this = ir::Module::getGlobalVars_abi_cxx11_(local_18);
  __end1 = std::__cxx11::list<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::begin
                     (this);
  var = (GlobalVar *)
        std::__cxx11::list<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::end(this)
  ;
  while (bVar1 = std::operator!=(&__end1,(_Self *)&var), bVar1) {
    local_78 = std::_List_const_iterator<mocker::ir::GlobalVar>::operator*(&__end1);
    psVar2 = ir::GlobalVar::getLabel_abi_cxx11_(local_78);
    std::operator+(&local_98,"L",psVar2);
    psVar2 = ir::GlobalVar::getData_abi_cxx11_(local_78);
    nasm::Section::emplaceLine<mocker::nasm::Db,std::__cxx11::string_const&>
              (__return_storage_ptr__,&local_98,psVar2);
    std::__cxx11::string::~string((string *)&local_98);
    std::_List_const_iterator<mocker::ir::GlobalVar>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

nasm::Section genDataSection(const ir::Module &irModule) {
  nasm::Section res(".data");
  for (auto &var : irModule.getGlobalVars()) {
    res.emplaceLine<nasm::Db>("L" + var.getLabel(), var.getData());
  }
  return res;
}